

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

bool __thiscall llvm::yaml::Input::beginBitSetScalar(Input *this,bool *DoClear)

{
  HNode *hnode;
  size_type __n;
  const_iterator __position;
  iterator iVar1;
  Twine local_80;
  bool local_51;
  _Bit_type *local_50;
  uint local_48;
  _Bit_iterator local_40;
  undefined1 local_30 [12];
  ret_type local_20;
  SequenceHNode *SQ;
  bool *DoClear_local;
  Input *this_local;
  
  SQ = (SequenceHNode *)DoClear;
  DoClear_local = (bool *)this;
  std::vector<bool,_std::allocator<bool>_>::clear(&this->BitValuesUsed);
  local_20 = dyn_cast<llvm::yaml::Input::SequenceHNode,llvm::yaml::Input::HNode>(this->CurrentNode);
  if (local_20 == (ret_type)0x0) {
    hnode = this->CurrentNode;
    Twine::Twine(&local_80,"expected sequence of bit values");
    setError(this,hnode,&local_80);
  }
  else {
    iVar1 = std::vector<bool,_std::allocator<bool>_>::begin(&this->BitValuesUsed);
    local_50 = iVar1.super__Bit_iterator_base._M_p;
    local_48 = iVar1.super__Bit_iterator_base._M_offset;
    local_40.super__Bit_iterator_base._M_p = local_50;
    local_40.super__Bit_iterator_base._M_offset = local_48;
    std::_Bit_const_iterator::_Bit_const_iterator((_Bit_const_iterator *)local_30,&local_40);
    __n = std::
          vector<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>,_std::allocator<std::unique_ptr<llvm::yaml::Input::HNode,_std::default_delete<llvm::yaml::Input::HNode>_>_>_>
          ::size(&local_20->Entries);
    local_51 = false;
    __position.super__Bit_iterator_base._12_4_ = 0;
    __position.super__Bit_iterator_base._M_p = (_Bit_type *)local_30._0_8_;
    __position.super__Bit_iterator_base._M_offset = local_30._8_4_;
    std::vector<bool,_std::allocator<bool>_>::insert(&this->BitValuesUsed,__position,__n,&local_51);
  }
  *(undefined1 *)&(SQ->super_HNode)._vptr_HNode = 1;
  return true;
}

Assistant:

bool Input::beginBitSetScalar(bool &DoClear) {
  BitValuesUsed.clear();
  if (SequenceHNode *SQ = dyn_cast<SequenceHNode>(CurrentNode)) {
    BitValuesUsed.insert(BitValuesUsed.begin(), SQ->Entries.size(), false);
  } else {
    setError(CurrentNode, "expected sequence of bit values");
  }
  DoClear = true;
  return true;
}